

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void xmlHashFree(xmlHashTablePtr hash,xmlHashDeallocator dealloc)

{
  uint uVar1;
  xmlHashEntry *pxVar2;
  xmlHashEntry *local_28;
  xmlHashEntry *entry;
  xmlHashEntry *end;
  xmlHashDeallocator dealloc_local;
  xmlHashTablePtr hash_local;
  
  if (hash != (xmlHashTablePtr)0x0) {
    if (hash->table != (xmlHashEntry *)0x0) {
      pxVar2 = hash->table;
      uVar1 = hash->size;
      for (local_28 = hash->table; local_28 < pxVar2 + uVar1; local_28 = local_28 + 1) {
        if (local_28->hashValue != 0) {
          if ((dealloc != (xmlHashDeallocator)0x0) && (local_28->payload != (void *)0x0)) {
            (*dealloc)(local_28->payload,local_28->key);
          }
          if (hash->dict == (xmlDictPtr)0x0) {
            if (local_28->key != (xmlChar *)0x0) {
              (*xmlFree)(local_28->key);
            }
            if (local_28->key2 != (xmlChar *)0x0) {
              (*xmlFree)(local_28->key2);
            }
            if (local_28->key3 != (xmlChar *)0x0) {
              (*xmlFree)(local_28->key3);
            }
          }
        }
      }
      (*xmlFree)(hash->table);
    }
    if (hash->dict != (xmlDictPtr)0x0) {
      xmlDictFree(hash->dict);
    }
    (*xmlFree)(hash);
  }
  return;
}

Assistant:

void
xmlHashFree(xmlHashTablePtr hash, xmlHashDeallocator dealloc) {
    if (hash == NULL)
        return;

    if (hash->table) {
        const xmlHashEntry *end = &hash->table[hash->size];
        const xmlHashEntry *entry;

        for (entry = hash->table; entry < end; entry++) {
            if (entry->hashValue == 0)
                continue;
            if ((dealloc != NULL) && (entry->payload != NULL))
                dealloc(entry->payload, entry->key);
            if (hash->dict == NULL) {
                if (entry->key)
                    xmlFree(entry->key);
                if (entry->key2)
                    xmlFree(entry->key2);
                if (entry->key3)
                    xmlFree(entry->key3);
            }
        }

        xmlFree(hash->table);
    }

    if (hash->dict)
        xmlDictFree(hash->dict);

    xmlFree(hash);
}